

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall
wallet::BerkeleyROCursor::BerkeleyROCursor
          (BerkeleyROCursor *this,BerkeleyRODatabase *database,Span<const_std::byte> prefix)

{
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  pVar1;
  BytePrefix local_20;
  long local_10;
  
  local_20.prefix.m_size = prefix.m_size;
  local_20.prefix.m_data = prefix.m_data;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__DatabaseCursor_00b17360;
  this->m_database = database;
  (this->m_cursor)._M_node = (_Base_ptr)0x0;
  (this->m_cursor_end)._M_node = (_Base_ptr)0x0;
  pVar1 = std::
          _Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
          ::_M_equal_range_tr<wallet::BytePrefix,void>
                    ((_Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                      *)&database->m_records,&local_20);
  this->m_cursor = (const_iterator)pVar1.first._M_node;
  this->m_cursor_end = (const_iterator)pVar1.second._M_node;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BerkeleyROCursor::BerkeleyROCursor(const BerkeleyRODatabase& database, Span<const std::byte> prefix)
    : m_database(database)
{
    std::tie(m_cursor, m_cursor_end) = m_database.m_records.equal_range(BytePrefix{prefix});
}